

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_stack.c
# Opt level: O0

void push_control_stack(control_stack *s,control_frame val)

{
  control_frame *__src;
  uint64 uVar1;
  control_frame *pcVar2;
  void *old_bp;
  control_stack *s_local;
  
  uVar1 = get_control_stack_size(s);
  if (s->cap < uVar1 + 1) {
    s->cap = s->cap + 0x10;
    __src = s->bp;
    pcVar2 = (control_frame *)malloc(s->cap * 0x48);
    s->bp = pcVar2;
    pcVar2 = s->bp;
    uVar1 = get_control_stack_size(s);
    memcpy(pcVar2,__src,uVar1 * 0x48);
    pcVar2 = s->bp;
    uVar1 = get_control_stack_size(s);
    s->sp = pcVar2 + uVar1;
    free(__src);
  }
  memcpy(s->sp,&val,0x48);
  s->sp = s->sp + 1;
  s->size = s->size + 1;
  return;
}

Assistant:

void push_control_stack(control_stack *s, control_frame val) {
    if ((get_control_stack_size(s) + 1) > s->cap) {
        s->cap += CONTROL_STACK_INIT_SIZE;
        void *old_bp = s->bp;
        s->bp = malloc(s->cap * CONTROL_STACK_ELE_SIZE);
        memcpy(s->bp, old_bp, get_control_stack_size(s) * CONTROL_STACK_ELE_SIZE);
        s->sp = s->bp + get_control_stack_size(s);
        free(old_bp);
    }
    *(s->sp) = val;
    s->sp += 1;
    s->size++;
}